

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::RowSingletonPS::execute
          (RowSingletonPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  uint uVar1;
  type_conflict5 tVar2;
  bool bVar3;
  int iVar4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  VarStatus *pVVar6;
  char *pcVar7;
  VarStatus VVar8;
  int __c;
  int __c_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDI;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *in_R9;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *in_stack_00000008;
  byte in_stack_00000010;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  newUp;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  newLo;
  int k;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_17;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_17;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_16;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_16;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_15;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_15;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_14;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_13;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_13;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_12;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_10;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_9;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_7;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_11;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_6;
  undefined4 in_stack_ffffffffffffe838;
  int in_stack_ffffffffffffe83c;
  cpp_dec_float<50U,_int,_void> *in_stack_ffffffffffffe840;
  cpp_dec_float<50U,_int,_void> *this_00;
  undefined4 in_stack_ffffffffffffe848;
  undefined4 in_stack_ffffffffffffe84c;
  undefined8 in_stack_ffffffffffffe850;
  uint *puVar9;
  undefined4 in_stack_ffffffffffffe858;
  undefined4 in_stack_ffffffffffffe85c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe860;
  byte local_1741;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe8c0;
  cpp_dec_float<50U,_int,_void> *in_stack_ffffffffffffe8c8;
  byte local_1729;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe928;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe930;
  undefined1 local_1698 [56];
  undefined1 local_1660 [56];
  undefined1 local_1628 [56];
  undefined1 local_15f0 [56];
  undefined1 local_15b8 [56];
  undefined1 local_1580 [56];
  undefined8 local_1548;
  undefined1 local_1540 [56];
  undefined1 local_1508 [56];
  undefined1 local_14d0 [56];
  undefined1 local_1498 [56];
  undefined1 local_1460 [56];
  undefined1 local_1428 [56];
  undefined1 local_13f0 [56];
  undefined8 local_13b8;
  undefined8 local_13b0;
  undefined1 local_13a8 [56];
  undefined1 local_1370 [56];
  undefined1 local_1338 [56];
  undefined1 local_1300 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_12c8;
  undefined1 local_1290 [56];
  undefined1 local_1258 [56];
  undefined1 local_1220 [56];
  undefined1 local_11e8 [56];
  undefined8 local_11b0;
  undefined1 local_11a8 [56];
  undefined1 local_1170 [56];
  undefined1 local_1138 [56];
  undefined1 local_1100 [56];
  undefined1 local_10c8 [56];
  undefined1 local_1090 [56];
  undefined1 local_1058 [56];
  undefined1 local_1020 [56];
  undefined1 local_fe8 [56];
  undefined1 local_fb0 [56];
  undefined1 local_f78 [56];
  undefined8 local_f40;
  undefined1 local_f38 [56];
  undefined1 local_f00 [56];
  undefined1 local_ec8 [56];
  undefined1 local_e90 [56];
  undefined1 local_e58 [56];
  undefined1 local_e20 [56];
  undefined1 local_de8 [56];
  undefined1 local_db0 [56];
  undefined1 local_d78 [56];
  undefined1 local_d40 [56];
  undefined1 local_d08 [56];
  undefined1 local_cd0 [56];
  undefined1 local_c98 [56];
  undefined1 local_c60 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c28;
  undefined1 local_bf0 [56];
  undefined1 local_bb8 [56];
  undefined1 local_b80 [56];
  undefined1 local_b48 [56];
  undefined1 local_b10 [56];
  undefined1 local_ad8 [56];
  undefined1 local_aa0 [56];
  undefined1 local_a68 [56];
  undefined1 local_a30 [56];
  undefined1 local_9f8 [56];
  undefined4 local_9c0;
  undefined1 local_9bc [56];
  undefined4 local_984;
  undefined1 local_980 [56];
  undefined1 local_948 [56];
  uint local_910;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_90c;
  undefined1 local_8d4 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_89c;
  byte local_861;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_860;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_830;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_828;
  undefined1 *local_820;
  undefined1 *local_818;
  undefined1 *local_810;
  undefined1 *local_808;
  uint *local_800;
  undefined1 *local_7f8;
  uint *local_7f0;
  undefined1 *local_7e8;
  uint *local_7e0;
  undefined1 *local_7d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_7d0;
  undefined1 *local_7c8;
  uint *local_7c0;
  undefined1 *local_7b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_7b0;
  undefined1 *local_7a8;
  uint *local_7a0;
  undefined1 *local_798;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_790;
  undefined1 *local_788;
  uint *local_780;
  undefined1 *local_778;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_770;
  undefined1 *local_768;
  int32_t *local_760;
  undefined1 *local_758;
  uint *local_750;
  undefined1 *local_748;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_740;
  undefined1 *local_738;
  undefined1 *local_730;
  undefined1 *local_728;
  uint *local_720;
  undefined1 *local_718;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_710;
  undefined1 *local_708;
  undefined1 *local_700;
  undefined1 *local_6f8;
  uint *local_6f0;
  undefined1 *local_6e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6e0;
  undefined1 *local_6d8;
  uint *local_6d0;
  undefined1 *local_6c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6c0;
  undefined1 *local_6b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6b0;
  undefined1 *local_6a8;
  uint *local_6a0;
  undefined1 *local_698;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_690;
  undefined1 *local_688;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_680;
  undefined1 *local_678;
  undefined1 *local_670;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_668;
  undefined1 *local_660;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_658;
  undefined1 *local_650;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_648;
  undefined1 *local_640;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_638;
  undefined1 *local_630;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_628;
  undefined1 *local_620;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_618;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_610;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_608;
  cpp_dec_float<50U,_int,_void> *local_600;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5e8;
  uint *local_5e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5c8;
  uint *local_5c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5b8;
  uint *local_5b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5a8;
  uint *local_5a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_598;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_590;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_588;
  uint *local_580;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_578;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_570;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_568;
  uint *local_560;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_558;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_550;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_548;
  uint *local_540;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_538;
  uint *local_530;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_528;
  uint *local_520;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_518;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_510;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_508;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_500;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_4e9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4c0;
  undefined1 *local_4b8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_4a9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4a8;
  int32_t *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_488;
  int32_t *local_480;
  undefined1 *local_478;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_469;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_468;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_448;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_440;
  undefined1 *local_438;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_429;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_428;
  int32_t *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_408;
  int32_t *local_400;
  undefined1 *local_3f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_3e9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3c0;
  undefined1 *local_3b8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_3a9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a8;
  int32_t *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_388;
  int32_t *local_380;
  undefined1 *local_378;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_369;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_368;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_348;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_340;
  undefined1 *local_338;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_329;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_328;
  int32_t *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_308;
  int32_t *local_300;
  undefined1 *local_2f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_2e9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c0;
  undefined1 *local_2b8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_2a9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a8;
  int32_t *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_288;
  int32_t *local_280;
  undefined1 *local_278;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_269;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_268;
  int32_t *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_248;
  int32_t *local_240;
  undefined1 *local_238;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_229;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_228;
  int32_t *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_208;
  int32_t *local_200;
  undefined1 *local_1f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1e9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e8;
  int32_t *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c8;
  int32_t *local_1c0;
  undefined1 *local_1b8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1a9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_188;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_180;
  undefined1 *local_178;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_169;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  undefined1 *local_138;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_129;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  undefined1 *local_e0;
  undefined8 *local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d0;
  undefined8 *local_c8;
  undefined8 *local_c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  undefined8 *local_b0;
  undefined8 *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  undefined8 *local_98;
  undefined8 *local_90;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  undefined8 *local_80;
  undefined8 *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  undefined8 *local_68;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_59;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffe850 >> 0x20);
  local_861 = in_stack_00000010 & 1;
  local_860 = in_R9;
  if ((in_RDI->m_backend).exp != *(int *)&(in_RDI->m_backend).neg) {
    pnVar5 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
    local_4f8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
    local_500 = pnVar5;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (in_stack_ffffffffffffe840,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
    pnVar5 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
    local_508 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
    local_510 = pnVar5;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (in_stack_ffffffffffffe840,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
    pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
             ::operator[](in_stack_00000008,(in_RDI->m_backend).exp);
    VVar8 = *pVVar6;
    pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
             ::operator[](in_stack_00000008,*(int *)&(in_RDI->m_backend).neg);
    *pVVar6 = VVar8;
  }
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT44(in_stack_ffffffffffffe85c,in_stack_ffffffffffffe858),iVar4);
  local_128 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
  local_118 = local_8d4;
  local_120 = &local_89c;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_129,local_120,local_128);
  local_110 = local_8d4;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffe840);
  local_f8 = local_8d4;
  local_100 = local_120;
  local_108 = local_128;
  boost::multiprecision::default_ops::
  eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (in_stack_ffffffffffffe840,
             (cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838),
             (cpp_dec_float<50U,_int,_void> *)0x3f3cd3);
  local_618 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
  local_620 = local_8d4;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (in_stack_ffffffffffffe840,
             (cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
  local_830 = in_RDI + 3;
  local_828 = &local_90c;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffe840,
             (cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
  for (local_910 = 0; uVar1 = local_910,
      iVar4 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::size((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)(in_RDI[4].m_backend.data._M_elems + 2)), (int)uVar1 < iVar4;
      local_910 = local_910 + 1) {
    pcVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::index((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)(in_RDI[4].m_backend.data._M_elems + 2),(char *)(ulong)local_910,__c);
    if ((int)pcVar7 != (in_RDI->m_backend).exp) {
      pnVar5 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::value((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)(in_RDI[4].m_backend.data._M_elems + 2),local_910);
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::index((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)(in_RDI[4].m_backend.data._M_elems + 2),(char *)(ulong)local_910,__c_00);
      local_168 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
      local_158 = local_948;
      local_160 = pnVar5;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_169,pnVar5,local_168);
      local_150 = local_948;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffe840);
      local_138 = local_948;
      local_140 = local_160;
      local_148 = local_168;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838),
                 (cpp_dec_float<50U,_int,_void> *)0x3f3ed9);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
      ::operator-=(in_stack_ffffffffffffe860,
                   (self_type *)CONCAT44(in_stack_ffffffffffffe85c,in_stack_ffffffffffffe858));
    }
  }
  local_984 = 0;
  tVar2 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT44(in_stack_ffffffffffffe84c,in_stack_ffffffffffffe848),
                     (int *)in_stack_ffffffffffffe840);
  if (tVar2) {
    local_1e0 = &(in_RDI->m_backend).prec_elem;
    local_1d8 = local_980;
    local_1e8 = &local_89c;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_1e9,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_1e0,local_1e8);
    local_1d0 = local_980;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_ffffffffffffe840);
    local_1b8 = local_980;
    local_1c0 = local_1e0;
    local_1c8 = local_1e8;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (in_stack_ffffffffffffe840,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838),
               (cpp_dec_float<50U,_int,_void> *)0x3f3fea);
  }
  else {
    local_220 = &in_RDI[1].m_backend.prec_elem;
    local_218 = local_980;
    local_228 = &local_89c;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_229,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_220,local_228);
    local_210 = local_980;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_ffffffffffffe840);
    local_1f8 = local_980;
    local_200 = local_220;
    local_208 = local_228;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (in_stack_ffffffffffffe840,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838),
               (cpp_dec_float<50U,_int,_void> *)0x3f40aa);
  }
  local_9c0 = 0;
  tVar2 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT44(in_stack_ffffffffffffe84c,in_stack_ffffffffffffe848),
                     (int *)in_stack_ffffffffffffe840);
  if (tVar2) {
    local_260 = &in_RDI[1].m_backend.prec_elem;
    local_258 = local_9bc;
    local_268 = &local_89c;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_269,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_260,local_268);
    local_250 = local_9bc;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_ffffffffffffe840);
    local_238 = local_9bc;
    local_240 = local_260;
    local_248 = local_268;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (in_stack_ffffffffffffe840,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838),
               (cpp_dec_float<50U,_int,_void> *)0x3f418e);
  }
  else {
    local_2a0 = &(in_RDI->m_backend).prec_elem;
    local_298 = local_9bc;
    local_2a8 = &local_89c;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_2a9,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_2a0,local_2a8);
    local_290 = local_9bc;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_ffffffffffffe840);
    local_278 = local_9bc;
    local_280 = local_2a0;
    local_288 = local_2a8;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (in_stack_ffffffffffffe840,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838),
               (cpp_dec_float<50U,_int,_void> *)0x3f424e);
  }
  pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
           ::operator[](local_860,(in_RDI->m_backend).fpclass);
  switch(*pVVar6) {
  case ON_UPPER:
    local_6a0 = in_RDI[7].m_backend.data._M_elems + 8;
    local_698 = local_1580;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_ffffffffffffe840,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
    local_690 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
    local_688 = local_15b8;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_ffffffffffffe840,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
    (**(code **)(*(long *)(in_RDI->m_backend).data._M_elems + 0x30))(local_15f0);
    bVar3 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_stack_ffffffffffffe930,in_stack_ffffffffffffe928,in_RDI);
    if (bVar3) {
      pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               ::operator[](in_stack_00000008,(in_RDI->m_backend).exp);
      *pVVar6 = BASIC;
      puVar9 = in_RDI[8].m_backend.data._M_elems + 8;
      local_5d8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
      local_5e0 = puVar9;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
      local_5e8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
      local_5f0 = &local_90c;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
    }
    else {
      pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               ::operator[](local_860,(in_RDI->m_backend).fpclass);
      *pVVar6 = BASIC;
      local_4a0 = &(in_RDI->m_backend).prec_elem;
      local_498 = local_1628;
      local_4a8 = &local_89c;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_4a9,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_4a0,local_4a8);
      local_490 = local_1628;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffe840);
      local_478 = local_1628;
      local_480 = local_4a0;
      local_488 = local_4a8;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838),
                 (cpp_dec_float<50U,_int,_void> *)0x3f605c);
      local_680 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
      local_678 = local_1660;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
      (**(code **)(*(long *)(in_RDI->m_backend).data._M_elems + 0x30))(local_1698);
      bVar3 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_ffffffffffffe930,in_stack_ffffffffffffe928,in_RDI);
      VVar8 = (VarStatus)bVar3;
      pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               ::operator[](in_stack_00000008,(in_RDI->m_backend).exp);
      *pVVar6 = VVar8;
      local_4d8 = &stack0xffffffffffffe930;
      local_4e0 = &local_90c;
      local_4e8 = &local_89c;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_4e9,local_4e0,local_4e8);
      local_4d0 = &stack0xffffffffffffe930;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffe840);
      local_4b8 = &stack0xffffffffffffe930;
      local_4c0 = local_4e0;
      local_4c8 = local_4e8;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838),
                 (cpp_dec_float<50U,_int,_void> *)0x3f61be);
      local_668 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
      local_670 = &stack0xffffffffffffe930;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
      local_e8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
      local_f0 = &stack0xffffffffffffe928;
      local_e0 = local_f0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                (in_stack_ffffffffffffe8c8,(double)in_stack_ffffffffffffe8c0);
    }
    break;
  case ON_LOWER:
    local_6d0 = in_RDI[6].m_backend.data._M_elems + 8;
    local_6c8 = local_13f0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_ffffffffffffe840,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
    local_6c0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
    local_6b8 = local_1428;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_ffffffffffffe840,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
    (**(code **)(*(long *)(in_RDI->m_backend).data._M_elems + 0x30))(local_1460);
    bVar3 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_stack_ffffffffffffe930,in_stack_ffffffffffffe928,in_RDI);
    if (bVar3) {
      pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               ::operator[](in_stack_00000008,(in_RDI->m_backend).exp);
      *pVVar6 = BASIC;
      puVar9 = in_RDI[8].m_backend.data._M_elems + 8;
      local_5b8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
      local_5c0 = puVar9;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
      local_5c8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
      local_5d0 = &local_90c;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
    }
    else {
      pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               ::operator[](local_860,(in_RDI->m_backend).fpclass);
      *pVVar6 = BASIC;
      local_420 = &(in_RDI->m_backend).prec_elem;
      local_418 = local_1498;
      local_428 = &local_89c;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_429,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_420,local_428);
      local_410 = local_1498;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffe840);
      local_3f8 = local_1498;
      local_400 = local_420;
      local_408 = local_428;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838),
                 (cpp_dec_float<50U,_int,_void> *)0x3f5bf4);
      local_6b0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
      local_6a8 = local_14d0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
      (**(code **)(*(long *)(in_RDI->m_backend).data._M_elems + 0x30))(local_1508);
      bVar3 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_ffffffffffffe930,in_stack_ffffffffffffe928,in_RDI);
      VVar8 = (VarStatus)bVar3;
      pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               ::operator[](in_stack_00000008,(in_RDI->m_backend).exp);
      *pVVar6 = VVar8;
      local_458 = local_1540;
      local_460 = &local_90c;
      local_468 = &local_89c;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_469,local_460,local_468);
      local_450 = local_1540;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffe840);
      local_438 = local_1540;
      local_440 = local_460;
      local_448 = local_468;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838),
                 (cpp_dec_float<50U,_int,_void> *)0x3f5d56);
      local_658 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
      local_660 = local_1540;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
      local_1548 = 0;
      local_d0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
      local_d8 = &local_1548;
      local_c8 = local_d8;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                (in_stack_ffffffffffffe8c8,(double)in_stack_ffffffffffffe8c0);
    }
    break;
  case FIXED:
    tVar2 = boost::multiprecision::operator<=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838),
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x3f42ae);
    if ((tVar2) &&
       (tVar2 = boost::multiprecision::operator>=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x3f42d3), tVar2)) {
      pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               ::operator[](in_stack_00000008,(in_RDI->m_backend).exp);
      *pVVar6 = BASIC;
      local_518 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
      local_520 = in_RDI[8].m_backend.data._M_elems + 8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
      return;
    }
    local_818 = local_9f8;
    local_820 = local_980;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_ffffffffffffe840,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
    local_808 = local_a30;
    local_810 = local_9bc;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_ffffffffffffe840,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
    (**(code **)(*(long *)(in_RDI->m_backend).data._M_elems + 0x30))(local_a68);
    bVar3 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_stack_ffffffffffffe930,in_stack_ffffffffffffe928,in_RDI);
    if (!bVar3) {
      local_728 = local_1020;
      local_730 = local_980;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
      local_720 = in_RDI[7].m_backend.data._M_elems + 8;
      local_718 = local_1058;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
      (**(code **)(*(long *)(in_RDI->m_backend).data._M_elems + 0x30))(local_1090);
      bVar3 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_ffffffffffffe930,in_stack_ffffffffffffe928,in_RDI);
      if (bVar3) {
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
        (**(code **)(*(long *)(in_RDI->m_backend).data._M_elems + 0x30))(local_10c8);
        tVar2 = boost::multiprecision::operator>=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x3f4f1d);
        if (!tVar2) {
          pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   ::operator[](local_860,(in_RDI->m_backend).fpclass);
          *pVVar6 = ON_UPPER;
          pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   ::operator[](in_stack_00000008,(in_RDI->m_backend).exp);
          *pVVar6 = BASIC;
          local_558 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
          local_560 = in_RDI[8].m_backend.data._M_elems + 8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (in_stack_ffffffffffffe840,
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
          local_568 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
          local_570 = &local_90c;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (in_stack_ffffffffffffe840,
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
          return;
        }
        local_320 = &(in_RDI->m_backend).prec_elem;
        local_318 = local_1100;
        local_328 = &local_89c;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_329,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_320,local_328);
        local_310 = local_1100;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  (in_stack_ffffffffffffe840);
        local_2f8 = local_1100;
        local_300 = local_320;
        local_308 = local_328;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (in_stack_ffffffffffffe840,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838),
                   (cpp_dec_float<50U,_int,_void> *)0x3f4fe1);
        local_710 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
        local_708 = local_1138;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  (in_stack_ffffffffffffe840,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
        (**(code **)(*(long *)(in_RDI->m_backend).data._M_elems + 0x30))(local_1170);
        bVar3 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (in_stack_ffffffffffffe930,in_stack_ffffffffffffe928,in_RDI);
        pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                 ::operator[](in_stack_00000008,(in_RDI->m_backend).exp);
        *pVVar6 = (uint)bVar3;
        pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                 ::operator[](local_860,(in_RDI->m_backend).fpclass);
        *pVVar6 = BASIC;
        local_358 = local_11a8;
        local_360 = &local_90c;
        local_368 = &local_89c;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_369,local_360,local_368);
        local_350 = local_11a8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  (in_stack_ffffffffffffe840);
        local_338 = local_11a8;
        local_340 = local_360;
        local_348 = local_368;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (in_stack_ffffffffffffe840,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838),
                   (cpp_dec_float<50U,_int,_void> *)0x3f5164);
        local_638 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
        local_640 = local_11a8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_stack_ffffffffffffe840,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
        local_11b0 = 0;
        local_88 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
        local_90 = &local_11b0;
        local_80 = local_90;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  (in_stack_ffffffffffffe8c8,(double)in_stack_ffffffffffffe8c0);
        return;
      }
      local_6f8 = local_11e8;
      local_700 = local_9bc;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
      local_6f0 = in_RDI[6].m_backend.data._M_elems + 8;
      local_6e8 = local_1220;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
      (**(code **)(*(long *)(in_RDI->m_backend).data._M_elems + 0x30))(local_1258);
      bVar3 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_ffffffffffffe930,in_stack_ffffffffffffe928,in_RDI);
      if (!bVar3) {
        pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                 ::operator[](in_stack_00000008,(in_RDI->m_backend).exp);
        *pVVar6 = BASIC;
        local_598 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
        local_5a0 = in_RDI[8].m_backend.data._M_elems + 8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_stack_ffffffffffffe840,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
        return;
      }
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
      (**(code **)(*(long *)(in_RDI->m_backend).data._M_elems + 0x30))(&local_12c8);
      local_50 = local_1290;
      local_58 = &local_12c8;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_59,local_58);
      local_40 = local_1290;
      local_48 = local_58;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
      local_38 = local_1290;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
                (in_stack_ffffffffffffe840);
      tVar2 = boost::multiprecision::operator<=
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3f546b);
      if (!tVar2) {
        pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                 ::operator[](local_860,(in_RDI->m_backend).fpclass);
        *pVVar6 = ON_LOWER;
        pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                 ::operator[](in_stack_00000008,(in_RDI->m_backend).exp);
        *pVVar6 = BASIC;
        local_578 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
        local_580 = in_RDI[8].m_backend.data._M_elems + 8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_stack_ffffffffffffe840,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
        local_588 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
        local_590 = &local_90c;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_stack_ffffffffffffe840,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
        return;
      }
      local_3a0 = &(in_RDI->m_backend).prec_elem;
      local_398 = local_1300;
      local_3a8 = &local_89c;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_3a9,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_3a0,local_3a8);
      local_390 = local_1300;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffe840);
      local_378 = local_1300;
      local_380 = local_3a0;
      local_388 = local_3a8;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838),
                 (cpp_dec_float<50U,_int,_void> *)0x3f552f);
      local_6e0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
      local_6d8 = local_1338;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
      (**(code **)(*(long *)(in_RDI->m_backend).data._M_elems + 0x30))(local_1370);
      bVar3 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_ffffffffffffe930,in_stack_ffffffffffffe928,in_RDI);
      pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               ::operator[](in_stack_00000008,(in_RDI->m_backend).exp);
      *pVVar6 = (uint)bVar3;
      pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               ::operator[](local_860,(in_RDI->m_backend).fpclass);
      *pVVar6 = BASIC;
      local_3d8 = local_13a8;
      local_3e0 = &local_90c;
      local_3e8 = &local_89c;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_3e9,local_3e0,local_3e8);
      local_3d0 = local_13a8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffe840);
      local_3b8 = local_13a8;
      local_3c0 = local_3e0;
      local_3c8 = local_3e8;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838),
                 (cpp_dec_float<50U,_int,_void> *)0x3f56b2);
      local_648 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
      local_650 = local_13a8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
      local_13b0 = 0;
      local_a0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
      local_a8 = &local_13b0;
      local_98 = local_a8;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                (in_stack_ffffffffffffe8c8,(double)in_stack_ffffffffffffe8c0);
      return;
    }
    local_800 = in_RDI[6].m_backend.data._M_elems + 8;
    local_7f8 = local_aa0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_ffffffffffffe840,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
    local_7f0 = in_RDI[7].m_backend.data._M_elems + 8;
    local_7e8 = local_ad8;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_ffffffffffffe840,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
    (**(code **)(*(long *)(in_RDI->m_backend).data._M_elems + 0x30))(local_b10);
    bVar3 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_stack_ffffffffffffe930,in_stack_ffffffffffffe928,in_RDI);
    if (bVar3) {
      pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               ::operator[](in_stack_00000008,(in_RDI->m_backend).exp);
      *pVVar6 = BASIC;
      local_528 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
      local_530 = in_RDI[8].m_backend.data._M_elems + 8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
      return;
    }
    local_7e0 = in_RDI[6].m_backend.data._M_elems + 8;
    local_7d8 = local_b48;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_ffffffffffffe840,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
    local_7d0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
    local_7c8 = local_b80;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_ffffffffffffe840,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
    (**(code **)(*(long *)(in_RDI->m_backend).data._M_elems + 0x30))(local_bb8);
    bVar3 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_stack_ffffffffffffe930,in_stack_ffffffffffffe928,in_RDI);
    if (bVar3) {
      in_stack_ffffffffffffe8c8 =
           &VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c)->m_backend;
      (**(code **)(*(long *)(in_RDI->m_backend).data._M_elems + 0x30))(&local_c28);
      local_20 = local_bf0;
      local_28 = &local_c28;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_29,local_28);
      local_10 = local_bf0;
      local_18 = local_28;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
      local_8 = local_bf0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
                (in_stack_ffffffffffffe840);
      tVar2 = boost::multiprecision::operator<=
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3f46c2);
      local_1729 = 1;
      if (!tVar2) goto LAB_003f46d6;
    }
    else {
LAB_003f46d6:
      local_7c0 = in_RDI[7].m_backend.data._M_elems + 8;
      local_7b8 = local_c60;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
      local_7b0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
      local_7a8 = local_c98;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
      (**(code **)(*(long *)(in_RDI->m_backend).data._M_elems + 0x30))(local_cd0);
      bVar3 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_ffffffffffffe930,in_stack_ffffffffffffe928,in_RDI);
      if (bVar3) {
        in_stack_ffffffffffffe8c0 =
             VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
        (**(code **)(*(long *)(in_RDI->m_backend).data._M_elems + 0x30))(local_d08);
        tVar2 = boost::multiprecision::operator>=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x3f47da);
        local_1729 = 1;
        if (tVar2) goto LAB_003f497f;
      }
      local_7a0 = in_RDI[6].m_backend.data._M_elems + 8;
      local_798 = local_d40;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
      local_790 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
      local_788 = local_d78;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
      (**(code **)(*(long *)(in_RDI->m_backend).data._M_elems + 0x30))(local_db0);
      bVar3 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_ffffffffffffe930,in_stack_ffffffffffffe928,in_RDI);
      local_1741 = 0;
      if (!bVar3) {
        local_780 = in_RDI[7].m_backend.data._M_elems + 8;
        local_778 = local_de8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  (in_stack_ffffffffffffe840,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
        local_770 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
        local_768 = local_e20;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  (in_stack_ffffffffffffe840,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
        (**(code **)(*(long *)(in_RDI->m_backend).data._M_elems + 0x30))(local_e58);
        bVar3 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (in_stack_ffffffffffffe930,in_stack_ffffffffffffe928,in_RDI);
        local_1741 = bVar3 ^ 0xff;
      }
      local_1729 = local_1741;
    }
LAB_003f497f:
    if ((local_1729 & 1) == 0) {
      local_750 = in_RDI[6].m_backend.data._M_elems + 8;
      local_748 = local_f78;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
      local_740 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
      local_738 = local_fb0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
      (**(code **)(*(long *)(in_RDI->m_backend).data._M_elems + 0x30))(local_fe8);
      bVar3 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_ffffffffffffe930,in_stack_ffffffffffffe928,in_RDI);
      pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               ::operator[](local_860,(in_RDI->m_backend).fpclass);
      *pVVar6 = (uint)bVar3;
      pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               ::operator[](in_stack_00000008,(in_RDI->m_backend).exp);
      *pVVar6 = BASIC;
      local_538 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
      local_540 = in_RDI[8].m_backend.data._M_elems + 8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
      local_548 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
      local_550 = &local_90c;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
    }
    else {
      local_760 = &(in_RDI->m_backend).prec_elem;
      local_758 = local_e90;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
      local_1a0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
      local_198 = local_ec8;
      local_1a8 = &local_89c;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_1a9,local_1a0,local_1a8);
      local_190 = local_ec8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffe840);
      local_178 = local_ec8;
      local_180 = local_1a0;
      local_188 = local_1a8;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838),
                 (cpp_dec_float<50U,_int,_void> *)0x3f4a8f);
      (**(code **)(*(long *)(in_RDI->m_backend).data._M_elems + 0x30))(local_f00);
      bVar3 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_ffffffffffffe930,in_stack_ffffffffffffe928,in_RDI);
      pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               ::operator[](in_stack_00000008,(in_RDI->m_backend).exp);
      *pVVar6 = (uint)bVar3;
      pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               ::operator[](local_860,(in_RDI->m_backend).fpclass);
      *pVVar6 = BASIC;
      local_2d8 = local_f38;
      local_2e0 = &local_90c;
      local_2e8 = &local_89c;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_2e9,local_2e0,local_2e8);
      local_2d0 = local_f38;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffe840);
      local_2b8 = local_f38;
      local_2c0 = local_2e0;
      local_2c8 = local_2e8;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838),
                 (cpp_dec_float<50U,_int,_void> *)0x3f4bd3);
      local_628 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
      local_630 = local_f38;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_stack_ffffffffffffe840,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
      local_f40 = 0;
      local_70 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
      local_78 = &local_f40;
      local_68 = local_78;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                (in_stack_ffffffffffffe8c8,(double)in_stack_ffffffffffffe8c0);
    }
    break;
  case ZERO:
    pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
             ::operator[](in_stack_00000008,(in_RDI->m_backend).exp);
    *pVVar6 = BASIC;
    this_00 = (cpp_dec_float<50U,_int,_void> *)(in_RDI[8].m_backend.data._M_elems + 8);
    local_5f8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)this_00,in_stack_ffffffffffffe83c);
    local_600 = this_00;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (this_00,(cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
    local_608 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)this_00,in_stack_ffffffffffffe83c);
    local_610 = &local_90c;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (this_00,(cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
    break;
  case BASIC:
    pVVar6 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
             ::operator[](in_stack_00000008,(in_RDI->m_backend).exp);
    *pVVar6 = BASIC;
    local_5a8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
    local_5b0 = in_RDI[8].m_backend.data._M_elems + 8;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (in_stack_ffffffffffffe840,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe83c,in_stack_ffffffffffffe838));
    local_13b8 = 0;
    local_b8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)in_stack_ffffffffffffe840,in_stack_ffffffffffffe83c);
    local_c0 = &local_13b8;
    local_b0 = local_c0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              (in_stack_ffffffffffffe8c8,(double)in_stack_ffffffffffffe8c0);
  }
  return;
}

Assistant:

void SPxMainSM<R>::RowSingletonPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      y[m_old_i] = y[m_i];
      s[m_old_i] = s[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   R aij = m_col[m_i];
   assert(aij != 0.0);

   // primal:
   s[m_i] = aij * x[m_j];

   // dual & basis:
   R val = m_obj;

   for(int k = 0; k < m_col.size(); ++k)
   {
      if(m_col.index(k) != m_i)
         val -= m_col.value(k) * y[m_col.index(k)];
   }

   R newLo = (aij > 0) ? m_lhs / aij : m_rhs / aij; // implicit lhs
   R newUp = (aij > 0) ? m_rhs / aij : m_lhs / aij; // implicit rhs

   switch(cStatus[m_j])
   {
   case SPxSolverBase<R>::FIXED:
      if(newLo <= m_oldLo && newUp >= m_oldUp)
      {
         // this row is totally redundant, has not changed bound of xj
         rStatus[m_i] = SPxSolverBase<R>::BASIC;
         y[m_i] = m_row_obj;
      }
      else if(EQrel(newLo, newUp, this->feastol()))
      {
         // row is in the type  aij * xj = b
         assert(EQrel(newLo, x[m_j], this->feastol()));

         if(EQrel(m_oldLo, m_oldUp, this->feastol()))
         {
            // xj has been fixed in other row
            rStatus[m_i] = SPxSolverBase<R>::BASIC;
            y[m_i] = m_row_obj;
         }
         else if((EQrel(m_oldLo, x[m_j], this->feastol()) && r[m_j] <= -this->feastol())
                 || (EQrel(m_oldUp, x[m_j], this->feastol()) && r[m_j] >= this->feastol())
                 || (!EQrel(m_oldLo, x[m_j], this->feastol()) && !(EQrel(m_oldUp, x[m_j], this->feastol()))))
         {
            // if x_j on lower but reduced cost is negative, or x_j on upper but reduced cost is positive, or x_j not on bound: basic
            rStatus[m_i] = (EQrel(m_lhs, x[m_j] * aij,
                                  this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            y[m_i] = val / aij;
            r[m_j] = 0.0;
         }
         else
         {
            // set x_j on one of the bound
            assert(EQrel(m_oldLo, x[m_j], this->feastol()) || EQrel(m_oldUp, x[m_j], this->feastol()));

            cStatus[m_j] = EQrel(m_oldLo, x[m_j],
                                 this->feastol()) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
            rStatus[m_i] = SPxSolverBase<R>::BASIC;
            y[m_i] = m_row_obj;
            r[m_j] = val;
         }
      }
      else if(EQrel(newLo, m_oldUp, this->feastol()))
      {
         // row is in the type  xj >= b/aij, try to set xj on upper
         if(r[m_j] >= this->feastol())
         {
            // the reduced cost is positive, xj should in the basic
            assert(EQrel(m_rhs / aij, x[m_j], this->feastol()) || EQrel(m_lhs / aij, x[m_j], this->feastol()));

            rStatus[m_i] = (EQrel(m_lhs / aij, x[m_j],
                                  this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            y[m_i] = val / aij;
            r[m_j] = 0.0;
         }
         else
         {
            assert(EQrel(m_oldUp, x[m_j], this->feastol()));

            cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
            rStatus[m_i] = SPxSolverBase<R>::BASIC;
            y[m_i] = m_row_obj;
            r[m_j] = val;
         }
      }
      else if(EQrel(newUp, m_oldLo, this->feastol()))
      {
         // row is in the type  xj <= b/aij, try to set xj on lower
         if(r[m_j] <= -this->feastol())
         {
            // the reduced cost is negative, xj should in the basic
            assert(EQrel(m_rhs / aij, x[m_j], this->feastol()) || EQrel(m_lhs / aij, x[m_j], this->feastol()));

            rStatus[m_i] = (EQrel(m_lhs / aij, x[m_j],
                                  this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            y[m_i] = val / aij;
            r[m_j] = 0.0;
         }
         else
         {
            assert(EQrel(m_oldLo, x[m_j], this->feastol()));

            cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
            rStatus[m_i] = SPxSolverBase<R>::BASIC;
            y[m_i] = m_row_obj;
            r[m_j] = val;
         }
      }
      else
      {
         // the variable is set to FIXED by other constraints, i.e., this singleton row is redundant
         rStatus[m_i] = SPxSolverBase<R>::BASIC;
         y[m_i] = m_row_obj;
      }

      break;

   case SPxSolverBase<R>::BASIC:
      rStatus[m_i] = SPxSolverBase<R>::BASIC;
      y[m_i] = m_row_obj;
      r[m_j] = 0.0;
      break;

   case SPxSolverBase<R>::ON_LOWER:
      if(EQrel(m_oldLo, x[m_j], this->feastol())) // xj may stay on lower
      {
         rStatus[m_i] = SPxSolverBase<R>::BASIC;
         y[m_i] = m_row_obj;
         r[m_j] = val;
      }
      else // if reduced costs are negative or old lower bound not equal to xj, we need to change xj into the basis
      {
         assert(!isOptimal || EQrel(m_rhs / aij, x[m_j], this->feastol())
                || EQrel(m_lhs / aij, x[m_j], this->feastol()));

         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (EQrel(m_lhs / aij, x[m_j],
                               this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
         y[m_i] = val / aij;
         r[m_j] = 0.0;
      }

      break;

   case SPxSolverBase<R>::ON_UPPER:
      if(EQrel(m_oldUp, x[m_j], this->feastol())) // xj may stay on upper
      {
         rStatus[m_i] = SPxSolverBase<R>::BASIC;
         y[m_i] = m_row_obj;
         r[m_j] = val;
      }
      else // if reduced costs are positive or old upper bound not equal to xj, we need to change xj into the basis
      {
         assert(!isOptimal || EQrel(m_rhs / aij, x[m_j], this->feastol())
                || EQrel(m_lhs / aij, x[m_j], this->feastol()));

         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (EQrel(m_lhs / aij, x[m_j],
                               this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
         y[m_i] = val / aij;
         r[m_j] = 0.0;
      }

      break;

   case SPxSolverBase<R>::ZERO:
      rStatus[m_i] = SPxSolverBase<R>::BASIC;
      y[m_i] = m_row_obj;
      r[m_j] = val;
      break;

   default:
      break;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM17 Dimension doesn't match after this step.");
   }

#endif
}